

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::FileDescriptor::DebugStringWithOptions_abi_cxx11_
          (string *__return_storage_ptr__,FileDescriptor *this,
          DebugStringOptions *debug_string_options)

{
  Edition EVar1;
  FeatureSet *from;
  bool bVar2;
  FileDescriptor *pFVar3;
  FeatureSet *this_00;
  EnumDescriptor *this_01;
  FieldDescriptor *pFVar4;
  Descriptor *pDVar5;
  ServiceDescriptor *this_02;
  int i;
  int iVar6;
  int i_3;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  anon_union_8_1_a8a14541_for_iterator_2 local_210;
  char *local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  Descriptor *local_1e0;
  flat_hash_set<const_google::protobuf::Descriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  public_dependencies;
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  weak_dependencies;
  FileOptions full_options;
  SourceLocationCommentPrinter comment_printer;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  public_dependencies.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = (ctrl_t *)0x0;
  public_dependencies.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  public_dependencies.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  full_options.super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)
       CONCAT44(full_options.super_Message.super_MessageLite._vptr_MessageLite._4_4_,0xc);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&public_dependencies,(int *)&full_options);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&comment_printer,"",(allocator<char> *)&local_210);
  anon_unknown_24::SourceLocationCommentPrinter::SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)&full_options,this,
             (vector<int,_std::allocator<int>_> *)&public_dependencies,(string *)&comment_printer,
             debug_string_options);
  std::__cxx11::string::~string((string *)&comment_printer);
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)&full_options,__return_storage_ptr__);
  EVar1 = this->edition_;
  if ((int)EVar1 < 1000) {
    if (EVar1 == EDITION_PROTO3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"proto3",(allocator<char> *)&weak_dependencies);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"proto2",(allocator<char> *)&weak_dependencies);
    }
    comment_printer.source_loc_._0_8_ = local_210.slot_;
    comment_printer._0_8_ = local_208;
    format_00._M_str = "syntax = \"$0\";\n\n";
    format_00._M_len = 0x10;
    absl::lts_20250127::SubstituteAndAppend
              (__return_storage_ptr__,format_00,(Arg *)&comment_printer);
  }
  else {
    local_210.slot_ = (slot_type *)&local_200;
    local_200 = 0;
    uStack_1f8 = 0;
    local_208 = (char *)0x0;
    weak_dependencies.
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
    ._0_4_ = EVar1;
    comment_printer._0_16_ =
         absl::lts_20250127::strings_internal::ExtractStringification<google::protobuf::Edition>
                   ((StringifySink *)&local_210,(Edition *)&weak_dependencies);
    format._M_str = "edition = \"$0\";\n\n";
    format._M_len = 0x11;
    absl::lts_20250127::SubstituteAndAppend(__return_storage_ptr__,format,(Arg *)&comment_printer);
  }
  std::__cxx11::string::~string((string *)&local_210);
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)&full_options,__return_storage_ptr__);
  anon_unknown_24::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)&full_options);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&public_dependencies);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&full_options,"",(allocator<char> *)&local_210);
  comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.leading_comments.field_2;
  comment_printer.source_loc_.leading_comments._M_string_length = 0;
  comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
  comment_printer.source_loc_.trailing_comments._M_string_length = 0;
  comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  comment_printer.options_.include_comments = debug_string_options->include_comments;
  comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
  comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
  std::__cxx11::string::string((string *)&comment_printer.prefix_,(string *)&full_options);
  if (debug_string_options->include_comments == true) {
    bVar2 = GetSourceLocation(this,&comment_printer.source_loc_);
  }
  else {
    bVar2 = false;
  }
  comment_printer.have_source_loc_ = bVar2;
  std::__cxx11::string::~string((string *)&full_options);
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
            (&comment_printer,__return_storage_ptr__);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
  ::raw_hash_set<int*>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
              *)&public_dependencies,this->public_dependencies_,
             this->public_dependencies_ + this->public_dependency_count_,0,(hasher *)&full_options,
             (key_equal *)&local_210,(allocator_type *)&weak_dependencies);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
  ::raw_hash_set<int*>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
              *)&weak_dependencies,this->weak_dependencies_,
             this->weak_dependencies_ + this->weak_dependency_count_,0,(hasher *)&full_options,
             (key_equal *)&local_210,(allocator_type *)&groups);
  iVar6 = 0;
  while (local_210._0_4_ = iVar6, iVar6 < this->dependency_count_) {
    bVar2 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
            ::contains<int>(&public_dependencies.
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                            ,(key_arg<int> *)&local_210);
    if (bVar2) {
      pFVar3 = dependency(this,local_210._0_4_);
      full_options.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           (intptr_t)(pFVar3->name_->_M_dataplus)._M_p;
      full_options.super_Message.super_MessageLite._vptr_MessageLite =
           (_func_int **)pFVar3->name_->_M_string_length;
      format_01._M_str = "import public \"$0\";\n";
      format_01._M_len = 0x14;
      absl::lts_20250127::SubstituteAndAppend(__return_storage_ptr__,format_01,(Arg *)&full_options)
      ;
    }
    else {
      bVar2 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
              ::contains<int>(&weak_dependencies.
                               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                              ,(key_arg<int> *)&local_210);
      if (bVar2) {
        pFVar3 = dependency(this,local_210._0_4_);
        full_options.super_Message.super_MessageLite._internal_metadata_.ptr_ =
             (intptr_t)(pFVar3->name_->_M_dataplus)._M_p;
        full_options.super_Message.super_MessageLite._vptr_MessageLite =
             (_func_int **)pFVar3->name_->_M_string_length;
        format_02._M_str = "import weak \"$0\";\n";
        format_02._M_len = 0x12;
        absl::lts_20250127::SubstituteAndAppend
                  (__return_storage_ptr__,format_02,(Arg *)&full_options);
      }
      else {
        pFVar3 = dependency(this,local_210._0_4_);
        full_options.super_Message.super_MessageLite._internal_metadata_.ptr_ =
             (intptr_t)(pFVar3->name_->_M_dataplus)._M_p;
        full_options.super_Message.super_MessageLite._vptr_MessageLite =
             (_func_int **)pFVar3->name_->_M_string_length;
        format_03._M_str = "import \"$0\";\n";
        format_03._M_len = 0xd;
        absl::lts_20250127::SubstituteAndAppend
                  (__return_storage_ptr__,format_03,(Arg *)&full_options);
      }
    }
    iVar6 = local_210._0_4_ + 1;
  }
  if (this->package_->_M_string_length != 0) {
    groups.
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.heap.control = (ctrl_t *)0x0;
    groups.
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 0;
    groups.
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    full_options.super_Message.super_MessageLite._vptr_MessageLite =
         (_func_int **)
         CONCAT44(full_options.super_Message.super_MessageLite._vptr_MessageLite._4_4_,2);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&groups,(int *)&full_options);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"",(allocator<char> *)&local_1e0);
    anon_unknown_24::SourceLocationCommentPrinter::SourceLocationCommentPrinter
              ((SourceLocationCommentPrinter *)&full_options,this,
               (vector<int,_std::allocator<int>_> *)&groups,(string *)&local_210,
               debug_string_options);
    std::__cxx11::string::~string((string *)&local_210);
    anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
              ((SourceLocationCommentPrinter *)&full_options,__return_storage_ptr__);
    local_208 = (this->package_->_M_dataplus)._M_p;
    local_210 = (anon_union_8_1_a8a14541_for_iterator_2)this->package_->_M_string_length;
    format_04._M_str = "package $0;\n\n";
    format_04._M_len = 0xd;
    absl::lts_20250127::SubstituteAndAppend(__return_storage_ptr__,format_04,(Arg *)&local_210);
    anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
              ((SourceLocationCommentPrinter *)&full_options,__return_storage_ptr__);
    anon_unknown_24::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
              ((SourceLocationCommentPrinter *)&full_options);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&groups);
  }
  FileOptions::FileOptions(&full_options,this->options_);
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    this_00 = FileOptions::mutable_features(&full_options);
    FeatureSet::CopyFrom(this_00,from);
  }
  bVar2 = anon_unknown_24::FormatLineOptions
                    (0,&full_options.super_Message,this->pool_,__return_storage_ptr__);
  if (bVar2) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  for (iVar6 = 0; iVar6 < this->enum_type_count_; iVar6 = iVar6 + 1) {
    this_01 = enum_type(this,iVar6);
    EnumDescriptor::DebugString(this_01,0,__return_storage_ptr__,debug_string_options);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  groups.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       1;
  groups.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  for (iVar6 = 0; iVar6 < this->extension_count_; iVar6 = iVar6 + 1) {
    EVar1 = this->edition_;
    pFVar4 = extension(this,iVar6);
    if (((int)EVar1 < 1000) && (pFVar4->type_ == '\n')) {
      pFVar4 = extension(this,iVar6);
      local_1e0 = FieldDescriptor::message_type(pFVar4);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::emplace<const_google::protobuf::Descriptor_*,_0>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>::iterator,_bool>
                  *)&local_210,
                 &groups.
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ,&local_1e0);
    }
  }
  for (iVar6 = 0; iVar6 < this->message_type_count_; iVar6 = iVar6 + 1) {
    local_210.slot_ = (slot_type *)message_type(this,iVar6);
    bVar2 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
            ::contains<google::protobuf::Descriptor_const*>
                      ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
                        *)&groups,(key_arg<const_google::protobuf::Descriptor_*> *)&local_210.slot_)
    ;
    if (!bVar2) {
      pDVar5 = message_type(this,iVar6);
      Descriptor::DebugString(pDVar5,0,__return_storage_ptr__,debug_string_options,true);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  for (iVar6 = 0; iVar6 < this->service_count_; iVar6 = iVar6 + 1) {
    this_02 = service(this,iVar6);
    ServiceDescriptor::DebugString(this_02,__return_storage_ptr__,debug_string_options);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pDVar5 = (Descriptor *)0x0;
  for (iVar6 = 0; iVar6 < this->extension_count_; iVar6 = iVar6 + 1) {
    pFVar4 = extension(this,iVar6);
    if (pFVar4->containing_type_ != pDVar5) {
      if (iVar6 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pFVar4 = extension(this,iVar6);
      pDVar5 = pFVar4->containing_type_;
      local_208 = (pDVar5->all_names_).payload_;
      local_210._2_6_ = 0;
      local_210._0_2_ = *(ushort *)(local_208 + 2);
      local_208 = local_208 + ~(ulong)local_210.slot_;
      format_05._M_str = "extend .$0 {\n";
      format_05._M_len = 0xd;
      absl::lts_20250127::SubstituteAndAppend(__return_storage_ptr__,format_05,(Arg *)&local_210);
    }
    pFVar4 = extension(this,iVar6);
    FieldDescriptor::DebugString(pFVar4,1,__return_storage_ptr__,debug_string_options);
  }
  if (0 < this->extension_count_) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
            (&comment_printer,__return_storage_ptr__);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~raw_hash_set(&groups.
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 );
  FileOptions::~FileOptions(&full_options);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  ::~raw_hash_set(&weak_dependencies.
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                 );
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  ::~raw_hash_set(&public_dependencies.
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                 );
  anon_unknown_24::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(&comment_printer);
  return __return_storage_ptr__;
}

Assistant:

std::string FileDescriptor::DebugStringWithOptions(
    const DebugStringOptions& debug_string_options) const {
  std::string contents;
  {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kSyntaxFieldNumber);
    SourceLocationCommentPrinter syntax_comment(this, path, "",
                                                debug_string_options);
    syntax_comment.AddPreComment(&contents);
    if (IsLegacyEdition(edition())) {
      absl::SubstituteAndAppend(&contents, "syntax = \"$0\";\n\n",
                                GetLegacySyntaxName(edition()));
    } else {
      absl::SubstituteAndAppend(&contents, "edition = \"$0\";\n\n", edition());
    }
    syntax_comment.AddPostComment(&contents);
  }

  SourceLocationCommentPrinter comment_printer(this, "", debug_string_options);
  comment_printer.AddPreComment(&contents);

  absl::flat_hash_set<int> public_dependencies(
      public_dependencies_, public_dependencies_ + public_dependency_count_);
  absl::flat_hash_set<int> weak_dependencies(
      weak_dependencies_, weak_dependencies_ + weak_dependency_count_);

  for (int i = 0; i < dependency_count(); i++) {
    if (public_dependencies.contains(i)) {
      absl::SubstituteAndAppend(&contents, "import public \"$0\";\n",
                                dependency(i)->name());
    } else if (weak_dependencies.contains(i)) {
      absl::SubstituteAndAppend(&contents, "import weak \"$0\";\n",
                                dependency(i)->name());
    } else {
      absl::SubstituteAndAppend(&contents, "import \"$0\";\n",
                                dependency(i)->name());
    }
  }

  if (!package().empty()) {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kPackageFieldNumber);
    SourceLocationCommentPrinter package_comment(this, path, "",
                                                 debug_string_options);
    package_comment.AddPreComment(&contents);
    absl::SubstituteAndAppend(&contents, "package $0;\n\n", package());
    package_comment.AddPostComment(&contents);
  }

  FileOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  if (FormatLineOptions(0, full_options, pool(), &contents)) {
    contents.append("\n");  // add some space if we had options
  }

  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(0, &contents, debug_string_options);
    contents.append("\n");
  }

  // Find all the 'group' type extensions; we will not output their nested
  // definitions (those will be done with their group field descriptor).
  absl::flat_hash_set<const Descriptor*> groups;
  for (int i = 0; i < extension_count(); i++) {
    if (IsGroupSyntax(edition(), extension(i))) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < message_type_count(); i++) {
    if (!groups.contains(message_type(i))) {
      message_type(i)->DebugString(0, &contents, debug_string_options,
                                   /* include_opening_clause */ true);
      contents.append("\n");
    }
  }

  for (int i = 0; i < service_count(); i++) {
    service(i)->DebugString(&contents, debug_string_options);
    contents.append("\n");
  }

  const Descriptor* containing_type = nullptr;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) contents.append("}\n\n");
      containing_type = extension(i)->containing_type();
      absl::SubstituteAndAppend(&contents, "extend .$0 {\n",
                                containing_type->full_name());
    }
    extension(i)->DebugString(1, &contents, debug_string_options);
  }
  if (extension_count() > 0) contents.append("}\n\n");

  comment_printer.AddPostComment(&contents);

  return contents;
}